

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_hdwallet.cpp
# Opt level: O3

void __thiscall
cfd::core::ExtPrivkey::ExtPrivkey(ExtPrivkey *this,ByteData *serialize_data,ByteData256 *tweak_sum)

{
  vector<unsigned_char,_std::allocator<unsigned_char>_> data;
  
  ByteData::ByteData(&this->serialize_data_);
  this->child_num_ = 0;
  this->version_ = 0;
  this->fingerprint_ = 0;
  this->depth_ = '\0';
  ByteData256::ByteData256(&this->chaincode_);
  Privkey::Privkey(&this->privkey_);
  ByteData256::ByteData256(&this->tweak_sum_);
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
            (&(this->tweak_sum_).data_,&tweak_sum->data_);
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)this,&serialize_data->data_);
  ByteData::GetBytes(&data,serialize_data);
  AnalyzeBip32KeyData((void *)0x0,(string *)0x0,&data,&this->version_,&this->depth_,
                      &this->child_num_,&this->chaincode_,&this->privkey_,(Pubkey *)0x0,
                      &this->fingerprint_);
  if (data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

ExtPrivkey::ExtPrivkey(
    const ByteData& serialize_data, const ByteData256& tweak_sum) {
  // unserialize
  tweak_sum_ = tweak_sum;
  serialize_data_ = serialize_data;
  std::vector<uint8_t> data = serialize_data.GetBytes();
  AnalyzeBip32KeyData(
      nullptr, nullptr, &data, &version_, &depth_, &child_num_, &chaincode_,
      &privkey_, nullptr, &fingerprint_);
}